

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  byte bVar1;
  pointer paVar2;
  function_record *pfVar3;
  _Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  _Var4;
  uint __val;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  PyTypeObject *pPVar10;
  long *plVar11;
  undefined8 *puVar12;
  type_info *ptVar13;
  detail *pdVar14;
  function_record *pfVar15;
  PyMethodDef *pPVar16;
  object *poVar17;
  PyObject *pPVar18;
  PyObject *pPVar19;
  freefunc p_Var20;
  error_already_set *this_00;
  ulong *puVar21;
  size_type *psVar22;
  ulong uVar23;
  richcmpfunc p_Var24;
  long *plVar25;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  long lVar26;
  function_record *pfVar27;
  PyTypeObject *pPVar28;
  char cVar29;
  PyTypeObject *pPVar30;
  undefined8 uVar31;
  PySequenceMethods *pPVar32;
  uint uVar33;
  uint __len;
  function_record *pfVar34;
  ulong uVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  function_record *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [32];
  undefined1 local_168 [39];
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_120;
  undefined1 local_118 [16];
  char *local_108;
  undefined1 auStack_100 [8];
  PyMethodDef *local_f8;
  PyMemberDef *local_f0;
  strdup_guard local_e8;
  descrgetfunc local_d0;
  undefined1 local_c8 [16];
  char *local_b8;
  object local_b0;
  unique_function_record *local_a8;
  freefunc local_a0;
  str local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar27 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = "";
  if (pfVar27->name != (char *)0x0) {
    pcVar9 = pfVar27->name;
  }
  local_f8 = (PyMethodDef *)this;
  local_f0 = (PyMemberDef *)types;
  local_d0 = (descrgetfunc)args;
  pcVar9 = strdup_guard::operator()(&local_e8,pcVar9);
  pfVar27->name = pcVar9;
  if (pfVar27->doc != (char *)0x0) {
    pcVar9 = strdup_guard::operator()(&local_e8,pfVar27->doc);
    pfVar27->doc = pcVar9;
  }
  pPVar28 = *(PyTypeObject **)
             &(pfVar27->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data;
  pPVar30 = *(PyTypeObject **)
             ((long)&(pfVar27->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             + 8);
  local_1b0 = pfVar27;
  local_a8 = unique_rec;
  if (pPVar28 != pPVar30) {
    do {
      pcVar9 = (char *)(pPVar28->ob_base).ob_base.ob_refcnt;
      if (pcVar9 != (char *)0x0) {
        pcVar9 = strdup_guard::operator()(&local_e8,pcVar9);
        (pPVar28->ob_base).ob_base.ob_refcnt = (Py_ssize_t)pcVar9;
      }
      pPVar10 = (pPVar28->ob_base).ob_base.ob_type;
      if (pPVar10 == (PyTypeObject *)0x0) {
        if ((pPVar28->ob_base).ob_size != 0) {
          auVar37 = PyObject_Repr();
          if (auVar37._0_8_ == (PyBufferProcs *)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_140._M_dataplus._M_p = (pointer)auVar37._0_8_;
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_1f0,(pybind11 *)&local_140,auVar37._8_8_);
          pPVar10 = (PyTypeObject *)strdup_guard::operator()(&local_e8,(char *)local_1f0._0_8_);
          (pPVar28->ob_base).ob_base.ob_type = pPVar10;
          if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
          }
          object::~object((object *)&local_140);
        }
      }
      else {
        pPVar10 = (PyTypeObject *)strdup_guard::operator()(&local_e8,(char *)pPVar10);
        (pPVar28->ob_base).ob_base.ob_type = pPVar10;
      }
      pPVar28 = (PyTypeObject *)&pPVar28->tp_basicsize;
    } while (pPVar28 != pPVar30);
  }
  pfVar27 = local_1b0;
  pcVar9 = local_1b0->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    bVar36 = true;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    bVar36 = iVar7 == 0;
  }
  bVar1 = pfVar27->field_0x59;
  pfVar27->field_0x59 = bVar1 & 0xfe | bVar36;
  if (((bVar1 & 2) == 0 & bVar36) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,(char *)(pfVar27->scope).m_ptr[1].ob_type,
               (allocator<char> *)&local_140);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,pfVar27->name,(allocator<char> *)(local_1e0 + 0x10));
    uVar31 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    plVar11 = (long *)std::__cxx11::string::append(local_118);
    pPVar28 = (PyTypeObject *)(plVar11 + 2);
    if ((PyTypeObject *)*plVar11 == pPVar28) {
      local_188._16_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
      local_188._24_8_ = plVar11[3];
      local_188._0_8_ = (PyObject *)(local_188 + 0x10);
    }
    else {
      local_188._16_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
      local_188._0_8_ = (PyObject *)*plVar11;
    }
    local_188._8_8_ = plVar11[1];
    *plVar11 = (long)pPVar28;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append(local_188,(ulong)local_140._M_dataplus._M_p);
    pPVar28 = (PyTypeObject *)&local_1a8.field_2;
    puVar21 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar21) {
      local_1a8.field_2._M_allocated_capacity = *puVar21;
      local_1a8.field_2._8_8_ = plVar11[3];
      local_1a8._M_dataplus._M_p = (pointer)pPVar28;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar21;
      local_1a8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1a8._M_string_length = plVar11[1];
    *plVar11 = (long)puVar21;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    psVar22 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar22) {
      local_1d0.field_2._M_allocated_capacity = *psVar22;
      local_1d0.field_2._8_8_ = puVar12[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar22;
      local_1d0._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_1d0._M_string_length = puVar12[1];
    *puVar12 = psVar22;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    PyErr_WarnEx(uVar31,local_1d0._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((PyTypeObject *)local_1a8._M_dataplus._M_p != pPVar28) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    if ((PyObject *)local_188._0_8_ != (PyObject *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    pfVar27 = local_1b0;
    if ((char **)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_,(ulong)((long)local_108 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
    }
  }
  local_120 = &pfVar27->args;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_a0 = (freefunc)local_1e0;
  bVar36 = false;
  pPVar30 = (PyTypeObject *)0x0;
  lVar26 = 0;
  do {
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        pPVar28 = *(PyTypeObject **)(local_f0 + lVar26 * 8);
        if (pPVar28 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1f0._0_8_ = pPVar28;
        ptVar13 = detail::get_type_info((type_index *)local_1f0,false);
        pfVar27 = local_1b0;
        lVar26 = lVar26 + 1;
        if (ptVar13 == (type_info *)0x0) {
          if (((local_1b0->field_0x59 & 2) == 0) || (pPVar30 != (PyTypeObject *)0x0)) {
            pPVar10 = (pPVar28->ob_base).ob_base.ob_type;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1f0,
                       (char *)((long)&(pPVar10->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar10->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)(local_1e0 + 0x10));
            detail::clean_type_id((string *)local_1f0);
            std::__cxx11::string::_M_append((char *)&local_140,local_1f0._0_8_);
            if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
              operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
            }
            goto LAB_0010d62d;
          }
          local_118._8_8_ = (local_1b0->scope).m_ptr;
          local_108 = "__module__";
          auStack_100 = (undefined1  [8])0x0;
          pdVar14 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar14,handle_00);
          local_188._0_8_ = local_188 + 0x10;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_188._24_8_ = local_1e0._8_8_;
          }
          else {
            local_188._0_8_ = local_1f0._0_8_;
          }
          local_188._16_8_ = local_1e0._0_8_;
          local_188._8_8_ = local_1f0._8_8_;
          plVar11 = (long *)std::__cxx11::string::append(local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar21 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_1a8.field_2._M_allocated_capacity = *puVar21;
            local_1a8.field_2._8_8_ = plVar11[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar21;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)puVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_c8._8_8_ = (pfVar27->scope).m_ptr;
          local_b8 = "__qualname__";
          local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar14 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar14,handle_02);
          local_168._0_8_ = local_1f0._0_8_;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_168._24_8_ = local_1e0._8_8_;
            local_168._0_8_ = (PyTypeObject *)(local_168 + 0x10);
          }
          local_168._16_8_ = local_1e0._0_8_;
          local_168._8_8_ = local_1f0._8_8_;
          uVar31 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar31 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (PySequenceMethods *)(local_1a8._M_string_length + local_1f0._8_8_)) {
            pPVar32 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
              pPVar32 = (PySequenceMethods *)local_1e0._0_8_;
            }
            if (pPVar32 < (PySequenceMethods *)(local_1a8._M_string_length + local_1f0._8_8_))
            goto LAB_0010d41d;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_168,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0010d41d:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1a8,local_168._0_8_);
          }
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          psVar22 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_1d0.field_2._M_allocated_capacity = *psVar22;
            local_1d0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar22;
            local_1d0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_1d0._M_string_length = puVar12[1];
          *puVar12 = psVar22;
          puVar12[1] = 0;
          *(undefined1 *)psVar22 = 0;
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          object::~object(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
          }
          object::~object((object *)auStack_100);
          pPVar30 = (PyTypeObject *)0x0;
        }
        else {
          pPVar28 = ptVar13->type;
          local_108 = "__module__";
          auStack_100 = (undefined1  [8])0x0;
          local_118._8_8_ = pPVar28;
          pdVar14 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar14,handle);
          local_188._0_8_ = local_188 + 0x10;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_188._24_8_ = local_1e0._8_8_;
          }
          else {
            local_188._0_8_ = local_1f0._0_8_;
          }
          local_188._16_8_ = local_1e0._0_8_;
          local_188._8_8_ = local_1f0._8_8_;
          plVar11 = (long *)std::__cxx11::string::append(local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar21 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_1a8.field_2._M_allocated_capacity = *puVar21;
            local_1a8.field_2._8_8_ = plVar11[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar21;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)puVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_b8 = "__qualname__";
          local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_c8._8_8_ = pPVar28;
          pdVar14 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar14,handle_01);
          local_168._0_8_ = local_1f0._0_8_;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_168._24_8_ = local_1e0._8_8_;
            local_168._0_8_ = (PyTypeObject *)(local_168 + 0x10);
          }
          local_168._16_8_ = local_1e0._0_8_;
          local_168._8_8_ = local_1f0._8_8_;
          uVar31 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar31 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (PySequenceMethods *)(local_1a8._M_string_length + local_1f0._8_8_)) {
            pPVar32 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
              pPVar32 = (PySequenceMethods *)local_1e0._0_8_;
            }
            if (pPVar32 < (PySequenceMethods *)(local_1a8._M_string_length + local_1f0._8_8_))
            goto LAB_0010d169;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_168,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0010d169:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1a8,local_168._0_8_);
          }
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          psVar22 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_1d0.field_2._M_allocated_capacity = *psVar22;
            local_1d0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar22;
            local_1d0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_1d0._M_string_length = puVar12[1];
          *puVar12 = psVar22;
          puVar12[1] = 0;
          *(undefined1 *)psVar22 = 0;
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          object::~object(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
          }
          object::~object((object *)auStack_100);
        }
      }
      else {
        if (bVar1 == 0) break;
LAB_0010cf7d:
        std::__cxx11::string::push_back((char)&local_140);
      }
    }
    else if (bVar1 == 0x7b) {
      bVar36 = true;
      if (((byte *)text)[1] != 0x2a) {
        if (((local_1b0->field_0x59 & 0x20) == 0) &&
           (pPVar30 == (PyTypeObject *)(ulong)local_1b0->nargs_pos)) {
          std::__cxx11::string::append((char *)&local_140);
        }
        paVar2 = (local_1b0->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((pPVar30 < (PyTypeObject *)
                        ((long)(local_1b0->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 5)) &&
            (*(long *)(paVar2 + (long)pPVar30 * 0x20) != 0)) ||
           ((local_1b0->field_0x59 & 0x10) != 0 && pPVar30 == (PyTypeObject *)0x0)) {
          std::__cxx11::string::append((char *)&local_140);
        }
        else {
          uVar35 = (long)pPVar30 - (ulong)(((byte)local_1b0->field_0x59 >> 4 & 1) != 0);
          cVar29 = '\x01';
          if (9 < uVar35) {
            uVar23 = uVar35;
            cVar6 = '\x04';
            do {
              cVar29 = cVar6;
              if (uVar23 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_0010d53c;
              }
              if (uVar23 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_0010d53c;
              }
              if (uVar23 < 10000) goto LAB_0010d53c;
              bVar36 = 99999 < uVar23;
              uVar23 = uVar23 / 10000;
              cVar6 = cVar29 + '\x04';
            } while (bVar36);
            cVar29 = cVar29 + '\x01';
          }
LAB_0010d53c:
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct((ulong)(local_1e0 + 0x10),cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1d0._M_dataplus._M_p,(uint)local_1d0._M_string_length,uVar35);
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_1e0 + 0x10),0,(char *)0x0,0x11589f);
          local_1f0._0_8_ = local_1e0;
          pPVar10 = (PyTypeObject *)(plVar11 + 2);
          if ((PyTypeObject *)*plVar11 == pPVar10) {
            local_1e0._0_8_ = (pPVar10->ob_base).ob_base.ob_refcnt;
            local_1e0._8_8_ = plVar11[3];
          }
          else {
            local_1e0._0_8_ = (pPVar10->ob_base).ob_base.ob_refcnt;
            local_1f0._0_8_ = (PyTypeObject *)*plVar11;
          }
          local_1f0._8_8_ = plVar11[1];
          *plVar11 = (long)pPVar10;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_140,local_1f0._0_8_);
          if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_140);
        bVar36 = false;
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010cf7d;
      if (((!bVar36) &&
          (paVar2 = (local_1b0->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pPVar30 < (PyTypeObject *)
                    ((long)(local_1b0->args).
                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 5))) &&
         (*(long *)(paVar2 + (long)pPVar30 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&local_140);
        std::__cxx11::string::append((char *)&local_140);
      }
      pPVar28 = (PyTypeObject *)((long)&(pPVar30->ob_base).ob_base.ob_refcnt + 1);
      if (((PyTypeObject *)(ulong)local_1b0->nargs_pos_only != (PyTypeObject *)0x0) &&
         (pPVar28 == (PyTypeObject *)(ulong)local_1b0->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&local_140);
      }
      if (!bVar36) {
        pPVar30 = pPVar28;
      }
    }
LAB_0010d62d:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((pPVar30 !=
       (PyTypeObject *)
       (local_d0 +
       (-(ulong)(((byte)local_1b0->field_0x59 >> 6 & 1) != 0) -
       (ulong)((byte)local_1b0->field_0x59 >> 5 & 1)))) || (*(long *)(local_f0 + lVar26 * 8) != 0))
  {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup_guard::operator()(&local_e8,local_140._M_dataplus._M_p);
  pfVar27 = local_1b0;
  local_1b0->signature = pcVar9;
  if ((local_1b0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_1b0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_120);
  }
  pfVar27->nargs = (uint16_t)local_d0;
  pPVar18 = (pfVar27->sibling).m_ptr;
  if (pPVar18 == (PyObject *)0x0) {
LAB_0010d7fc:
    pPVar16 = (PyMethodDef *)operator_new(0x20);
    pfVar27->def = pPVar16;
    *(undefined8 *)&pPVar16->ml_flags = 0;
    pPVar16->ml_doc = (char *)0x0;
    pPVar16->ml_name = pfVar27->name;
    pPVar16->ml_meth = dispatcher;
    pPVar16->ml_flags = 3;
    _Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (local_a8->_M_t).
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>;
    (local_a8->_M_t).
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false> =
         (_Head_base<0UL,_pybind11::detail::function_record_*,_false>)0x0;
    capsule::capsule((capsule *)(local_1e0 + 0x10),
                     (void *)_Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>
                             ._M_head_impl,initialize_generic::anon_class_1_0_00000001::__invoke);
    if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    pPVar18 = (pfVar27->scope).m_ptr;
    if (pPVar18 != (PyObject *)0x0) {
      iVar7 = PyObject_HasAttrString(pPVar18,"__module__");
      if (iVar7 == 1) {
        local_1f0._8_8_ = (pfVar27->scope).m_ptr;
        local_1e0._0_8_ = "__module__";
        local_1e0._8_8_ = (PyTypeObject *)0x0;
        poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1f0);
      }
      else {
        iVar7 = PyObject_HasAttrString((pfVar27->scope).m_ptr,"__name__");
        if (iVar7 != 1) goto LAB_0010d925;
        local_1f0._8_8_ = (pfVar27->scope).m_ptr;
        local_1e0._0_8_ = "__name__";
        local_1e0._8_8_ = (PyTypeObject *)0x0;
        poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1f0);
      }
      local_188._0_8_ = (poVar17->super_handle).m_ptr;
      if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)0x0) {
        (((PyVarObject *)&((PyObject *)local_188._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
             (((PyVarObject *)&((PyObject *)local_188._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
      }
      object::operator=((object *)&local_1a8,(object *)local_188);
      object::~object((object *)local_188);
      object::~object((object *)(local_1e0 + 8));
      pfVar27 = local_1b0;
    }
LAB_0010d925:
    pPVar18 = (PyObject *)
              PyCMethod_New(pfVar27->def,local_1d0._M_dataplus._M_p,local_1a8._M_dataplus._M_p,0);
    (((function *)&local_f8->ml_name)->super_object).super_handle.m_ptr = pPVar18;
    if (pPVar18 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_1a8);
    object::~object((object *)(local_1e0 + 0x10));
    p_Var20 = (freefunc)local_1e0;
    local_1f0._8_8_ = (PyObject *)0x0;
    local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
    uVar35 = CONCAT71((int7)((ulong)pPVar28 >> 8),1);
    local_1f0._0_8_ = p_Var20;
    local_a0 = p_Var20;
  }
  else {
    if (pPVar18->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar18 = (PyObject *)pPVar18[1].ob_refcnt;
      (pfVar27->sibling).m_ptr = pPVar18;
      if (pPVar18 == (PyObject *)0x0) goto LAB_0010d7fc;
    }
    if (pPVar18->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar7 = PyType_IsSubtype();
      pPVar18 = (pfVar27->sibling).m_ptr;
      if (iVar7 == 0) {
        if ((pPVar18 != (PyObject *)&_Py_NoneStruct) && (*pfVar27->name != '_')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,pfVar27->name,(allocator<char> *)local_188);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1e0 + 0x10),"Cannot overload existing non-function object \"",
                         &local_1a8);
          plVar11 = (long *)std::__cxx11::string::append(local_1e0 + 0x10);
          local_1f0._0_8_ = *plVar11;
          psVar22 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_1f0._0_8_ == psVar22) {
            local_1e0._0_8_ = *psVar22;
            local_1e0._8_8_ = plVar11[3];
            local_1f0._0_8_ = local_1e0;
          }
          else {
            local_1e0._0_8_ = *psVar22;
          }
          local_1f0._8_8_ = plVar11[1];
          *plVar11 = (long)psVar22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          pybind11_fail((string *)local_1f0);
        }
        goto LAB_0010d7fc;
      }
    }
    if (((*(byte *)(pPVar18[1].ob_refcnt + 0x10) & 0x20) == 0) &&
       (pPVar30 = pPVar18[1].ob_type, pPVar30 != (PyTypeObject *)0x0)) {
      if ((pPVar30->ob_base).ob_base.ob_type != (PyTypeObject *)&PyCapsule_Type) goto LAB_0010d72f;
      (pPVar30->ob_base).ob_base.ob_refcnt = (pPVar30->ob_base).ob_base.ob_refcnt + 1;
      local_1f0._0_8_ = pPVar30;
    }
    else {
      pPVar30 = (PyTypeObject *)0x0;
LAB_0010d72f:
      capsule::capsule((capsule *)local_1f0,pPVar30,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
    }
    pfVar15 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1f0);
    pfVar34 = local_1b0;
    pPVar18 = (pfVar15->scope).m_ptr;
    pPVar19 = (local_1b0->scope).m_ptr;
    object::~object((object *)local_1f0);
    pfVar27 = pfVar34;
    if (pPVar18 != pPVar19) goto LAB_0010d7fc;
    pPVar18 = (pfVar34->sibling).m_ptr;
    (((function *)&local_f8->ml_name)->super_object).super_handle.m_ptr = pPVar18;
    if (pPVar18 != (PyObject *)0x0) {
      pPVar18->ob_refcnt = pPVar18->ob_refcnt + 1;
    }
    bVar1 = pfVar34->field_0x59;
    if (((pfVar15->field_0x59 ^ bVar1) & 0x10) != 0) {
      pcVar9 = "instance";
      if ((bVar1 & 0x10) == 0) {
        pcVar9 = "static";
      }
      local_c8._0_8_ = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,pcVar9,pcVar9 + (ulong)((bVar1 & 0x10) >> 4) * 2 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8)
      ;
      plVar11 = (long *)std::__cxx11::string::append(local_168);
      local_118._0_8_ = *plVar11;
      p_Var24 = (richcmpfunc)(plVar11 + 2);
      if ((richcmpfunc)local_118._0_8_ == p_Var24) {
        local_108 = *(char **)p_Var24;
        auStack_100 = (undefined1  [8])plVar11[3];
        local_118._0_8_ = &local_108;
      }
      else {
        local_108 = *(char **)p_Var24;
      }
      local_118._8_8_ = plVar11[1];
      *plVar11 = (long)p_Var24;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_50.obj.m_ptr = (local_1b0->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_98,&local_50);
      str::operator_cast_to_string(&local_70,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     &local_70);
      plVar11 = (long *)std::__cxx11::string::append(local_188);
      local_1a8._M_dataplus._M_p = (pointer)*plVar11;
      plVar25 = plVar11 + 2;
      if ((long *)local_1a8._M_dataplus._M_p == plVar25) {
        local_1a8.field_2._M_allocated_capacity = *plVar25;
        local_1a8.field_2._8_8_ = plVar11[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *plVar25;
      }
      local_1a8._M_string_length = plVar11[1];
      *plVar11 = (long)plVar25;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_1b0->name,&local_141);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1e0 + 0x10),&local_1a8,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1e0 + 0x10),&local_140);
      pybind11_fail((string *)local_1f0);
    }
    pfVar3 = pfVar15;
    if ((char)bVar1 < '\0') {
      pfVar34->next = pfVar15;
      local_1f0._0_8_ = pPVar18[1].ob_type;
      if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_1f0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_1f0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
      _Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (local_a8->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>;
      (local_a8->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false> =
           (_Head_base<0UL,_pybind11::detail::function_record_*,_false>)0x0;
      capsule::set_pointer
                ((capsule *)local_1f0,
                 (void *)_Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                         _M_head_impl);
      if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      object::~object((object *)local_1f0);
    }
    else {
      do {
        pfVar27 = pfVar3;
        pfVar3 = pfVar27->next;
      } while (pfVar3 != (function_record *)0x0);
      _Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (local_a8->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>;
      (local_a8->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false> =
           (_Head_base<0UL,_pybind11::detail::function_record_*,_false>)0x0;
      pfVar27->next =
           (function_record *)
           _Var4.super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      pfVar27 = pfVar15;
      if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    p_Var20 = (freefunc)local_1e0;
    local_1f0._8_8_ = (PyObject *)0x0;
    local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
    local_1f0._0_8_ = p_Var20;
    if (DAT_0011d591 == 1) {
      std::__cxx11::string::append(local_1f0);
      std::__cxx11::string::append(local_1f0);
      p_Var20 = (freefunc)std::__cxx11::string::append(local_1f0);
    }
    if (pfVar27 == (function_record *)0x0) goto LAB_0010dbe5;
    uVar35 = 0;
  }
  iVar7 = 0;
  local_120 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)p_Var20 >> 8),1));
  local_d0 = (descrgetfunc)CONCAT44(local_d0._4_4_,(int)uVar35);
  do {
    if (DAT_0011d591 == 1) {
      if (0 < iVar7) {
        std::__cxx11::string::append(local_1f0);
      }
      if ((char)uVar35 == '\0') {
        uVar33 = iVar7 + 1;
        local_f0 = (PyMemberDef *)CONCAT44(local_f0._4_4_,uVar33);
        __val = -uVar33;
        if (0 < (int)uVar33) {
          __val = uVar33;
        }
        __len = 1;
        if (9 < __val) {
          uVar35 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar8 = (uint)uVar35;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_0010da33;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_0010da33;
            }
            if (uVar8 < 10000) goto LAB_0010da33;
            uVar35 = uVar35 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_0010da33:
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1a8,(char)__len - (char)((int)uVar33 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1a8._M_dataplus._M_p + (uVar33 >> 0x1f),__len,__val);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        psVar22 = puVar12 + 2;
        uVar35 = (ulong)local_d0 & 0xffffffff;
        iVar7 = (int)local_f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_1d0.field_2._M_allocated_capacity = *psVar22;
          local_1d0.field_2._8_8_ = puVar12[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar22;
          local_1d0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_1d0._M_string_length = puVar12[1];
        *puVar12 = psVar22;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::_M_append(local_1f0,(ulong)local_1d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_1f0);
      std::__cxx11::string::append(local_1f0);
      std::__cxx11::string::append(local_1f0);
    }
    if (((pfVar27->doc != (char *)0x0) && (*pfVar27->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_0011d591 | (byte)local_120) & 1) == 0) {
        std::__cxx11::string::append(local_1f0);
        local_120 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     *)((ulong)local_120 & 0xffffffff00000000);
      }
      else {
        local_120 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     *)CONCAT44(local_120._4_4_,
                                CONCAT31((int3)((ulong)local_120 >> 8),
                                         (byte)local_120 & DAT_0011d591));
      }
      if ((DAT_0011d591 & 1) != 0) {
        std::__cxx11::string::append(local_1f0);
      }
      std::__cxx11::string::append(local_1f0);
      if (DAT_0011d591 == 1) {
        std::__cxx11::string::append(local_1f0);
      }
    }
    pfVar27 = pfVar27->next;
    pfVar34 = local_1b0;
  } while (pfVar27 != (function_record *)0x0);
LAB_0010dbe5:
  pPVar18 = (((function *)&local_f8->ml_name)->super_object).super_handle.m_ptr;
  free(*(void **)(pPVar18[1].ob_refcnt + 0x18));
  if ((PyObject *)local_1f0._8_8_ == (PyObject *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = strdup((char *)local_1f0._0_8_);
  }
  p_Var20 = local_a0;
  *(char **)(pPVar18[1].ob_refcnt + 0x18) = pcVar9;
  if ((pfVar34->field_0x59 & 0x10) != 0) {
    pPVar19 = (PyObject *)
              PyInstanceMethod_New
                        ((((function *)&local_f8->ml_name)->super_object).super_handle.m_ptr);
    (((function *)&local_f8->ml_name)->super_object).super_handle.m_ptr = pPVar19;
    if (pPVar19 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar18->ob_refcnt = pPVar18->ob_refcnt + -1;
    if (pPVar18->ob_refcnt == 0) {
      _Py_Dealloc(pPVar18);
    }
  }
  if ((freefunc)local_1f0._0_8_ != p_Var20) {
    operator_delete((void *)local_1f0._0_8_,local_1e0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  strdup_guard::~strdup_guard(&local_e8);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "." +
                                 // Python 3.3+, but we backport it to earlier versions
                                 th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

#if PY_MAJOR_VERSION < 3
        if (std::strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("next");
        } else if (std::strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("__nonzero__");
        }
#endif
        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                capsule rec_capsule = isinstance<capsule>(self) ? reinterpret_borrow<capsule>(self)
                                                                : capsule(self);
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope)) {
                    chain = nullptr;
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if defined(NDEBUG)
                    "compile in debug mode for more details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += "\n";
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += "\n";
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += "\n";
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += "\n";
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }